

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

void __thiscall deqp::gles31::Functional::anon_unknown_1::BarrierCase::deinit(BarrierCase *this)

{
  de::SharedPtr<const_glu::ShaderProgram>::clear(&this->m_program);
  return;
}

Assistant:

void BarrierCase::deinit (void)
{
	m_program.clear();
}